

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tankmixmodel.cpp
# Opt level: O0

double __thiscall TankMixModel::storedMass(TankMixModel *this)

{
  Segment *local_20;
  Segment *seg;
  double totalMass;
  TankMixModel *this_local;
  
  seg = (Segment *)0x0;
  for (local_20 = this->firstSeg; local_20 != (Segment *)0x0; local_20 = local_20->next) {
    seg = (Segment *)(local_20->c * local_20->v + (double)seg);
  }
  return (double)seg;
}

Assistant:

double TankMixModel::storedMass()
{
    double totalMass = 0.0;
    Segment* seg = firstSeg;
    while (seg)
    {
        totalMass += seg->c * seg->v;
        seg = seg->next;
    }
    return totalMass;
}